

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::giveErrorOnAssignmentToProcessorProperty(StructuralParser *this)

{
  bool bVar1;
  ProcessorProperty *pPVar2;
  CompileMessage local_c0;
  CompileMessage local_88;
  char *local_50;
  char *local_48;
  char *local_30;
  undefined1 local_28 [8];
  Context context;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)this;
  getContext((Context *)local_28,this);
  local_30 = "processor";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d0889);
  if (bVar1) {
    local_48 = ".";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x4d44a1);
    if (bVar1) {
      pPVar2 = parseProcessorProperty(this);
      ignoreUnused<soul::AST::ProcessorProperty&>(pPVar2);
      local_50 = "=";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x4aecb7);
      if (bVar1) {
        Errors::cannotAssignToProcessorProperties<>();
        AST::Context::throwError((Context *)local_28,&local_88,false);
      }
      Errors::expectedStatement<>();
      AST::Context::throwError((Context *)local_28,&local_c0,false);
    }
  }
  AST::Context::~Context((Context *)local_28);
  return;
}

Assistant:

void giveErrorOnAssignmentToProcessorProperty()
    {
        auto context = getContext();

        if (matchIf (Keyword::processor) && matches (Operator::dot))
        {
            ignoreUnused (parseProcessorProperty());

            if (matches (Operator::assign))
                context.throwError (Errors::cannotAssignToProcessorProperties());

            context.throwError (Errors::expectedStatement());
        }
    }